

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void fast_forward_start_bits(compiler_common *common)

{
  jump_list *jump;
  BOOL BVar1;
  sljit_s32 sVar2;
  sljit_jump *psVar3;
  sljit_label *psVar4;
  jump_list *local_40;
  jump_list *matches;
  sljit_jump *found;
  sljit_jump *partial_quit;
  sljit_label *start;
  sljit_u8 *start_bits;
  sljit_compiler *compiler;
  compiler_common *common_local;
  
  start_bits = (sljit_u8 *)common->compiler;
  start = (sljit_label *)common->re->start_bitmap;
  matches = (jump_list *)0x0;
  local_40 = (jump_list *)0x0;
  compiler = (sljit_compiler *)common;
  if (common->match_end_ptr != 0) {
    sljit_emit_op1((sljit_compiler *)start_bits,0x20,1,0,0x8e,(long)common->match_end_ptr);
    sljit_emit_op1((sljit_compiler *)start_bits,0x20,5,0,0xd,0);
    sljit_emit_op2((sljit_compiler *)start_bits,0x60,1,0,1,0,0x40,2);
    sljit_emit_op2((sljit_compiler *)start_bits,0x1062,0,0,0xd,0,1,0);
    sljit_emit_cmov((sljit_compiler *)start_bits,4,0xd,1,0);
  }
  partial_quit = (sljit_jump *)sljit_emit_label((sljit_compiler *)start_bits);
  found = sljit_emit_cmp((sljit_compiler *)start_bits,3,2,0,0xd,0);
  if (*(int *)&compiler[1].labels == 1) {
    add_jump((sljit_compiler *)start_bits,(jump_list **)&compiler[2].abuf,found);
  }
  sljit_emit_op1((sljit_compiler *)start_bits,0x23,1,0,0x82,0);
  sljit_emit_op2((sljit_compiler *)start_bits,0x60,2,0,2,0,0x40,2);
  BVar1 = optimize_class((compiler_common *)compiler,(sljit_u8 *)start,
                         (uint)(((ulong)start[1].next & 0x8000000000000000) != 0),0,&local_40);
  if (BVar1 == 0) {
    if (((ulong)start[1].next & 0x8000000000000000) == 0) {
      psVar3 = sljit_emit_cmp((sljit_compiler *)start_bits,3,1,0,0x40,0xff);
      sljit_set_label(psVar3,(sljit_label *)partial_quit);
    }
    else {
      matches = (jump_list *)sljit_emit_cmp((sljit_compiler *)start_bits,3,1,0,0x40,0xff);
    }
    sljit_emit_op2((sljit_compiler *)start_bits,0x65,4,0,1,0,0x40,7);
    sljit_emit_op2((sljit_compiler *)start_bits,0x69,1,0,1,0,0x40,3);
    sljit_emit_op1((sljit_compiler *)start_bits,0x21,1,0,0x81,(sljit_sw)start);
    sVar2 = sljit_get_register_index(3);
    if (sVar2 < 0) {
      sljit_emit_op2((sljit_compiler *)start_bits,0x68,4,0,0x40,1,4,0);
      sljit_emit_op2((sljit_compiler *)start_bits,0x265,0,0,1,0,4,0);
    }
    else {
      sljit_emit_op2((sljit_compiler *)start_bits,0x68,3,0,0x40,1,4,0);
      sljit_emit_op2((sljit_compiler *)start_bits,0x265,0,0,1,0,3,0);
    }
    psVar3 = sljit_emit_jump((sljit_compiler *)start_bits,0);
    sljit_set_label(psVar3,(sljit_label *)partial_quit);
  }
  else {
    set_jumps(local_40,(sljit_label *)partial_quit);
  }
  jump = matches;
  if (matches != (jump_list *)0x0) {
    psVar4 = sljit_emit_label((sljit_compiler *)start_bits);
    sljit_set_label((sljit_jump *)jump,psVar4);
  }
  sljit_emit_op2((sljit_compiler *)start_bits,0x62,2,0,2,0,0x40,2);
  psVar3 = found;
  if (*(int *)&compiler[1].labels != 1) {
    psVar4 = sljit_emit_label((sljit_compiler *)start_bits);
    sljit_set_label(psVar3,psVar4);
  }
  if (compiler->fsaveds != 0) {
    sljit_emit_op1((sljit_compiler *)start_bits,0x20,0xd,0,5,0);
  }
  return;
}

Assistant:

static SLJIT_INLINE void fast_forward_start_bits(compiler_common *common)
{
DEFINE_COMPILER;
const sljit_u8 *start_bits = common->re->start_bitmap;
struct sljit_label *start;
struct sljit_jump *partial_quit;
#if PCRE2_CODE_UNIT_WIDTH != 8
struct sljit_jump *found = NULL;
#endif
jump_list *matches = NULL;

if (common->match_end_ptr != 0)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->match_end_ptr);
  OP1(SLJIT_MOV, RETURN_ADDR, 0, STR_END, 0);
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(1));
  OP2(SLJIT_SUB | SLJIT_SET_GREATER, SLJIT_UNUSED, 0, STR_END, 0, TMP1, 0);
  CMOV(SLJIT_GREATER, STR_END, TMP1, 0);
  }

start = LABEL();

partial_quit = CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0);
if (common->mode == PCRE2_JIT_COMPLETE)
  add_jump(compiler, &common->failed_match, partial_quit);

OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (!optimize_class(common, start_bits, (start_bits[31] & 0x80) != 0, FALSE, &matches))
  {
#if PCRE2_CODE_UNIT_WIDTH != 8
  if ((start_bits[31] & 0x80) != 0)
    found = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 255);
  else
    CMPTO(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 255, start);
#elif defined SUPPORT_UNICODE
  if (common->utf && is_char7_bitset(start_bits, FALSE))
    CMPTO(SLJIT_GREATER, TMP1, 0, SLJIT_IMM, 127, start);
#endif
  OP2(SLJIT_AND, TMP2, 0, TMP1, 0, SLJIT_IMM, 0x7);
  OP2(SLJIT_LSHR, TMP1, 0, TMP1, 0, SLJIT_IMM, 3);
  OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)start_bits);
  if (sljit_get_register_index(TMP3) >= 0)
    {
    OP2(SLJIT_SHL, TMP3, 0, SLJIT_IMM, 1, TMP2, 0);
    OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, TMP3, 0);
    }
  else
    {
    OP2(SLJIT_SHL, TMP2, 0, SLJIT_IMM, 1, TMP2, 0);
    OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, TMP2, 0);
    }
  JUMPTO(SLJIT_ZERO, start);
  }
else
  set_jumps(matches, start);

#if PCRE2_CODE_UNIT_WIDTH != 8
if (found != NULL)
  JUMPHERE(found);
#endif

OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (common->mode != PCRE2_JIT_COMPLETE)
  JUMPHERE(partial_quit);

if (common->match_end_ptr != 0)
  OP1(SLJIT_MOV, STR_END, 0, RETURN_ADDR, 0);
}